

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize.c
# Opt level: O3

void av1_calculate_scaled_size(int *width,int *height,int resize_denom)

{
  int iVar1;
  int iVar2;
  
  if (resize_denom != 8) {
    iVar1 = *width;
    iVar2 = 0x10;
    if (iVar1 < 0x10) {
      iVar2 = iVar1;
    }
    iVar1 = (resize_denom / 2 + iVar1 * 8) / resize_denom;
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    *width = iVar2;
    iVar1 = *height;
    iVar2 = 0x10;
    if (iVar1 < 0x10) {
      iVar2 = iVar1;
    }
    iVar1 = (resize_denom / 2 + iVar1 * 8) / resize_denom;
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    *height = iVar2;
  }
  return;
}

Assistant:

static void calculate_scaled_size_helper(int *dim, int denom) {
  if (denom != SCALE_NUMERATOR) {
    // We need to ensure the constraint in "Appendix A" of the spec:
    // * FrameWidth is greater than or equal to 16
    // * FrameHeight is greater than or equal to 16
    // For this, we clamp the downscaled dimension to at least 16. One
    // exception: if original dimension itself was < 16, then we keep the
    // downscaled dimension to be same as the original, to ensure that resizing
    // is valid.
    const int min_dim = AOMMIN(16, *dim);
    // Use this version if we need *dim to be even
    // *width = (*width * SCALE_NUMERATOR + denom) / (2 * denom);
    // *width <<= 1;
    *dim = (*dim * SCALE_NUMERATOR + denom / 2) / (denom);
    *dim = AOMMAX(*dim, min_dim);
  }
}